

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void snapshot_with_uncomitted_data_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  fdb_status extraout_EAX;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  __atomic_base<unsigned_long> _Var11;
  char *handle;
  fdb_kvs_handle *pfVar12;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *in_RCX;
  btree *extraout_RDX;
  fdb_kvs_handle *doc_01;
  uint uVar15;
  __atomic_base<unsigned_long> unaff_RBP;
  long lVar16;
  fdb_iterator *pfVar17;
  char *unaff_R12;
  fdb_kvs_handle *pfVar18;
  char *unaff_R13;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  fdb_config *pfVar22;
  btree *__s;
  char *unaff_R15;
  fdb_doc **ppfVar23;
  fdb_iterator *config;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db0;
  fdb_kvs_handle *db1;
  fdb_file_handle *db_file;
  fdb_kvs_info info;
  timeval __test_begin;
  char key [256];
  char cmd [256];
  fdb_doc *pfStack_1bb8;
  fdb_iterator *pfStack_1bb0;
  int iStack_1ba4;
  fdb_kvs_handle *pfStack_1ba0;
  timeval tStack_1b98;
  fdb_kvs_handle *pfStack_1b88;
  fdb_kvs_handle *pfStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_kvs_handle *pfStack_1b70;
  fdb_iterator *pfStack_1b68;
  fdb_iterator *pfStack_1b60;
  fdb_kvs_handle *pfStack_1b50;
  fdb_kvs_handle *pfStack_1b48;
  undefined1 auStack_1b40 [24];
  fdb_kvs_handle *pfStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  undefined1 auStack_1b08 [80];
  undefined8 auStack_1ab8 [5];
  fdb_doc *apfStack_1a90 [6];
  fdb_kvs_info fStack_1a60;
  timeval tStack_1a30;
  undefined1 auStack_1a20 [280];
  fdb_iterator fStack_1908;
  fdb_kvs_handle fStack_1808;
  fdb_kvs_handle *pfStack_1600;
  btree *pbStack_15f8;
  fdb_kvs_handle *pfStack_15f0;
  code *pcStack_15e8;
  fdb_iterator *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  fdb_kvs_handle *pfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  atomic<unsigned_long> *paStack_15b8;
  size_t sStack_15b0;
  fdb_kvs_handle *pfStack_15a8;
  fdb_kvs_info fStack_15a0;
  undefined1 auStack_1570 [14];
  undefined2 uStack_1562;
  undefined1 auStack_1560 [520];
  fdb_kvs_handle *pfStack_1358;
  fdb_kvs_handle *pfStack_1350;
  fdb_kvs_handle *pfStack_1348;
  fdb_kvs_handle *pfStack_1340;
  fdb_kvs_handle *pfStack_1338;
  fdb_kvs_handle *pfStack_1330;
  undefined1 auStack_1320 [8];
  fdb_file_handle *pfStack_1318;
  fdb_kvs_handle *pfStack_1310;
  fdb_kvs_handle *pfStack_1308;
  fdb_iterator *pfStack_1300;
  undefined1 auStack_12f8 [48];
  undefined1 auStack_12c8 [64];
  hbtrie *phStack_1288;
  kvs_ops_stat *pkStack_1280;
  timeval tStack_1258;
  btreeblk_handle *apbStack_1248 [33];
  undefined1 auStack_1140 [32];
  undefined2 uStack_1120;
  undefined1 uStack_1100;
  code *pcStack_10e8;
  undefined4 uStack_10e0;
  fdb_txn *pfStack_10d8;
  fdb_kvs_handle *pfStack_1048;
  char acStack_1040 [256];
  fdb_kvs_handle *pfStack_f40;
  fdb_kvs_handle *pfStack_f38;
  fdb_kvs_handle *pfStack_f30;
  fdb_kvs_handle *pfStack_f28;
  fdb_kvs_handle *pfStack_f20;
  fdb_kvs_handle *pfStack_f18;
  fdb_kvs_handle *pfStack_f08;
  uint uStack_efc;
  fdb_iterator *pfStack_ef8;
  fdb_kvs_handle *pfStack_ef0;
  undefined4 *puStack_ee8;
  fdb_kvs_handle *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_iterator *pfStack_ed0;
  fdb_file_handle *pfStack_ec8;
  fdb_iterator *pfStack_ec0;
  size_t sStack_eb8;
  undefined1 auStack_eb0 [32];
  timeval tStack_e90;
  undefined1 auStack_e80 [272];
  size_t sStack_d70;
  char *pcStack_d68;
  uint8_t uStack_d60;
  undefined2 uStack_d58;
  undefined1 uStack_d38;
  fdb_kvs_handle *pfStack_c80;
  char acStack_c78 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_b78;
  fdb_kvs_handle *pfStack_b70;
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b40;
  fdb_file_handle *pfStack_b38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b30;
  fdb_doc *pfStack_b28;
  fdb_kvs_handle *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_kvs_handle *pfStack_b08;
  fdb_kvs_handle *pfStack_b00;
  fdb_kvs_handle *pfStack_af8;
  fdb_kvs_config fStack_af0;
  fdb_kvs_config fStack_ad8;
  fdb_kvs_config fStack_ab8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_a98 [4];
  timeval tStack_a78;
  fdb_config fStack_a68;
  fdb_kvs_info *pfStack_950;
  atomic<unsigned_long> aStack_948;
  fdb_kvs_handle *pfStack_940;
  atomic<unsigned_long> aStack_938;
  fdb_kvs_handle *pfStack_930;
  atomic<unsigned_long> aStack_928;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_file_handle *pfStack_908;
  undefined1 auStack_900 [16];
  fdb_config *pfStack_8f0;
  fdb_kvs_info fStack_8e8;
  fdb_kvs_config fStack_8b8;
  undefined1 auStack_8a0 [176];
  char acStack_7f0 [256];
  undefined1 auStack_6f0 [512];
  fdb_config fStack_4f0;
  fdb_kvs_handle *pfStack_3f8;
  fdb_kvs_handle *pfStack_3f0;
  fdb_kvs_handle *pfStack_3e8;
  fdb_kvs_handle *pfStack_3e0;
  fdb_kvs_handle *pfStack_3d8;
  fdb_kvs_handle *pfStack_3d0;
  fdb_kvs_handle *local_3c8;
  fdb_kvs_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  fdb_kvs_handle *local_3b0;
  fdb_file_handle *local_3a8;
  undefined4 *local_3a0;
  undefined1 local_398 [48];
  fdb_kvs_handle *local_368;
  undefined1 local_360 [40];
  fdb_kvs_handle local_338;
  char acStack_130 [256];
  
  pfStack_3d0 = (fdb_kvs_handle *)0x11160a;
  gettimeofday((timeval *)(local_360 + 0x18),(__timezone_ptr_t)0x0);
  local_338.bub_ctx.handle = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_130,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_3d0 = (fdb_kvs_handle *)0x111632;
  system((char *)&local_338.bub_ctx.handle);
  pfStack_3d0 = (fdb_kvs_handle *)0x111637;
  memleak_start();
  pfStack_3d0 = (fdb_kvs_handle *)0x111641;
  pfVar7 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_3d0 = (fdb_kvs_handle *)0x11164e;
  srand(0x4d2);
  pfVar12 = (fdb_kvs_handle *)(local_338.config.encryption_key.bytes + 4);
  pfStack_3d0 = (fdb_kvs_handle *)0x11165e;
  fdb_get_default_config();
  local_338.config.block_reusing_threshold._0_1_ = 1;
  local_338.config.encryption_key.bytes[0x1c] = '\x01';
  local_338.config.breakpad_minidump_dir._0_1_ = 1;
  local_338.config.encryption_key.bytes[0xc] = '\0';
  local_338.config.encryption_key.bytes[0xd] = '\0';
  local_338.config.encryption_key.bytes[0xe] = '\0';
  local_338.config.encryption_key.bytes[0xf] = '\0';
  local_338.config.encryption_key.bytes[0x10] = '\0';
  local_338.config.encryption_key.bytes[0x11] = '\0';
  local_338.config.encryption_key.bytes[0x12] = '\0';
  local_338.config.encryption_key.bytes[0x13] = '\0';
  pfStack_3d0 = (fdb_kvs_handle *)0x11167e;
  fdb_get_default_kvs_config();
  pfStack_3d0 = (fdb_kvs_handle *)0x111692;
  fVar4 = fdb_open(&local_3a8,"./mvcc_test9",(fdb_config *)pfVar12);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b4a;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1116b0;
  fVar4 = fdb_kvs_open(local_3a8,&local_3b8,(char *)0x0,(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b4f;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1116d3;
  fVar4 = fdb_kvs_open(local_3a8,&local_3b0,"db1",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b54;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1116f6;
  fVar4 = fdb_kvs_open(local_3a8,&local_3c0,"db2",(fdb_kvs_config *)in_RCX);
  pcVar20 = (char *)pfVar12;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b59;
  local_3a0 = (undefined4 *)((long)&pfVar7->kvs + 2);
  pcVar20 = "key%06d";
  unaff_R15 = (char *)&local_338;
  unaff_R12 = "value%d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_3d0 = (fdb_kvs_handle *)0x111731;
    sprintf(unaff_R15,"key%06d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(local_3a0 + 1) = 0x3e;
    *local_3a0 = 0x646e653c;
    pfStack_3d0 = (fdb_kvs_handle *)0x11175f;
    sprintf((char *)pfVar7,"value%d",unaff_RBP._M_i);
    pfVar12 = local_3b8;
    pfStack_3d0 = (fdb_kvs_handle *)0x11176c;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x111784;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar12,unaff_R15,sVar8 + 1,pfVar7,0x20);
    pfVar18 = local_3b0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_3d0 = (fdb_kvs_handle *)0x111b36;
      snapshot_with_uncomitted_data_test();
LAB_00111b36:
      unaff_R13 = (char *)pfVar12;
      pfStack_3d0 = (fdb_kvs_handle *)0x111b3b;
      snapshot_with_uncomitted_data_test();
LAB_00111b3b:
      pfStack_3d0 = (fdb_kvs_handle *)0x111b40;
      snapshot_with_uncomitted_data_test();
      goto LAB_00111b40;
    }
    pfStack_3d0 = (fdb_kvs_handle *)0x111799;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x1117b1;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar18,unaff_R15,sVar8 + 1,pfVar7,0x20);
    unaff_R13 = (char *)local_3c0;
    pfVar12 = pfVar18;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b36;
    pfStack_3d0 = (fdb_kvs_handle *)0x1117c6;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x1117de;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R15,sVar8 + 1,pfVar7,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b3b;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 10);
  pfStack_3d0 = (fdb_kvs_handle *)0x111800;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b5e;
  pfStack_3d0 = (fdb_kvs_handle *)0x11181a;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111b63;
  pfStack_3d0 = (fdb_kvs_handle *)0x111831;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b68;
  pfStack_3d0 = (fdb_kvs_handle *)0x11184b;
  fVar4 = fdb_snapshot_open(local_3b0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111b6d;
  pfStack_3d0 = (fdb_kvs_handle *)0x111862;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b72;
  pfStack_3d0 = (fdb_kvs_handle *)0x11187c;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111b77;
  pfStack_3d0 = (fdb_kvs_handle *)0x111890;
  fVar4 = fdb_commit(local_3a8,'\0');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b7c;
  pfStack_3d0 = (fdb_kvs_handle *)0x1118a7;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  pfVar12 = (fdb_kvs_handle *)local_398._8_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b81;
  pfStack_3d0 = (fdb_kvs_handle *)0x1118c2;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b86;
  unaff_R15 = local_398 + 8;
  if (pfVar12 != (fdb_kvs_handle *)local_398._8_8_) {
    pfStack_3d0 = (fdb_kvs_handle *)0x1118df;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_3d0 = (fdb_kvs_handle *)0x1118ee;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  pcVar20 = (char *)pfVar12;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b8b;
  if (pfVar12 != (fdb_kvs_handle *)local_398._8_8_) {
    pfStack_3d0 = (fdb_kvs_handle *)0x111908;
    snapshot_with_uncomitted_data_test();
  }
  local_368 = pfVar12;
  unaff_R15 = "key%06d";
  unaff_R12 = (char *)&local_338;
  unaff_R13 = "value%d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_3d0 = (fdb_kvs_handle *)0x111934;
    sprintf(unaff_R12,"key%06d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(local_3a0 + 1) = 0x3e;
    *local_3a0 = 0x646e653c;
    pfStack_3d0 = (fdb_kvs_handle *)0x111962;
    sprintf((char *)pfVar7,"value%d",unaff_RBP._M_i);
    pfVar12 = local_3b8;
    pfStack_3d0 = (fdb_kvs_handle *)0x11196f;
    sVar8 = strlen(unaff_R12);
    pfStack_3d0 = (fdb_kvs_handle *)0x111987;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar12,unaff_R12,sVar8 + 1,pfVar7,0x20);
    pcVar20 = (char *)local_3c0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b45;
    pfStack_3d0 = (fdb_kvs_handle *)0x11199c;
    sVar8 = strlen(unaff_R12);
    pfStack_3d0 = (fdb_kvs_handle *)0x1119b4;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)pcVar20,unaff_R12,sVar8 + 1,pfVar7,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b40;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 10);
  pfStack_3d0 = (fdb_kvs_handle *)0x1119d6;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b90;
  pfStack_3d0 = (fdb_kvs_handle *)0x1119f0;
  fVar4 = fdb_snapshot_open(local_3b0,&local_3c8,local_398._8_8_);
  pcVar20 = (char *)local_368;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b95;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a06;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b9a;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a1d;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111b9f;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a37;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111ba4;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a4f;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,(fdb_seqnum_t)pcVar20);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111ba9;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a60;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111bae;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a77;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111bb3;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a91;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111bb8;
  pfStack_3d0 = (fdb_kvs_handle *)0x111aa9;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,(fdb_seqnum_t)pcVar20);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111bbd;
  pfStack_3d0 = (fdb_kvs_handle *)0x111aba;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111bc2;
  pfStack_3d0 = (fdb_kvs_handle *)0x111acc;
  fVar4 = fdb_close(local_3a8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111bc7;
  pfStack_3d0 = (fdb_kvs_handle *)0x111ad9;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_3d0 = (fdb_kvs_handle *)0x111ae9;
    free(pfVar7);
    pfStack_3d0 = (fdb_kvs_handle *)0x111aee;
    memleak_end();
    pcVar20 = "%s PASSED\n";
    if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
      pcVar20 = "%s FAILED\n";
    }
    pfStack_3d0 = (fdb_kvs_handle *)0x111b1f;
    fprintf(_stderr,pcVar20,"snapshot with uncomitted data in other KVS test");
    return;
  }
  goto LAB_00111bcc;
LAB_00113057:
  pfStack_f18 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar7 = (fdb_kvs_handle *)pcVar20;
LAB_0011305c:
  pfStack_f18 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_f18 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_f18 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_f18 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar20 = (char *)pfVar7;
  pfStack_f18 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_f18 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_f18 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_f18 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_f18 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_f18 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_001130d2;
LAB_00113614:
  pfStack_1330 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_1330 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_1330 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_1330 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_15e8 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_15e8 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_15e8 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  _Var11._M_i = (__int_type)(auStack_1560 + 0x100);
  pfVar18 = (fdb_kvs_handle *)auStack_1560;
  pcStack_15e8 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_1b60 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar14 = pfVar13;
LAB_0011467d:
  pfVar13 = pfVar14;
  pfStack_1b60 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_1b60 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar7 = (fdb_kvs_handle *)&pfStack_1b48;
  pfStack_1b60 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00111b40:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b45;
  snapshot_with_uncomitted_data_test();
  pfVar12 = (fdb_kvs_handle *)pcVar20;
LAB_00111b45:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b4a;
  snapshot_with_uncomitted_data_test();
LAB_00111b4a:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b4f;
  snapshot_with_uncomitted_data_test();
LAB_00111b4f:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b54;
  snapshot_with_uncomitted_data_test();
LAB_00111b54:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b59;
  snapshot_with_uncomitted_data_test();
  pcVar20 = (char *)pfVar12;
LAB_00111b59:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b5e;
  snapshot_with_uncomitted_data_test();
LAB_00111b5e:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b63;
  snapshot_with_uncomitted_data_test();
LAB_00111b63:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b68;
  snapshot_with_uncomitted_data_test();
LAB_00111b68:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b6d;
  snapshot_with_uncomitted_data_test();
LAB_00111b6d:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b72;
  snapshot_with_uncomitted_data_test();
LAB_00111b72:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b77;
  snapshot_with_uncomitted_data_test();
LAB_00111b77:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b7c;
  snapshot_with_uncomitted_data_test();
LAB_00111b7c:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b81;
  snapshot_with_uncomitted_data_test();
LAB_00111b81:
  pfVar12 = (fdb_kvs_handle *)pcVar20;
  pfStack_3d0 = (fdb_kvs_handle *)0x111b86;
  snapshot_with_uncomitted_data_test();
LAB_00111b86:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b8b;
  snapshot_with_uncomitted_data_test();
  pcVar20 = (char *)pfVar12;
LAB_00111b8b:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b90;
  snapshot_with_uncomitted_data_test();
LAB_00111b90:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b95;
  snapshot_with_uncomitted_data_test();
LAB_00111b95:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b9a;
  snapshot_with_uncomitted_data_test();
LAB_00111b9a:
  pfStack_3d0 = (fdb_kvs_handle *)0x111b9f;
  snapshot_with_uncomitted_data_test();
LAB_00111b9f:
  pfStack_3d0 = (fdb_kvs_handle *)0x111ba4;
  snapshot_with_uncomitted_data_test();
LAB_00111ba4:
  pfStack_3d0 = (fdb_kvs_handle *)0x111ba9;
  snapshot_with_uncomitted_data_test();
LAB_00111ba9:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bae;
  snapshot_with_uncomitted_data_test();
LAB_00111bae:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bb3;
  snapshot_with_uncomitted_data_test();
LAB_00111bb3:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bb8;
  snapshot_with_uncomitted_data_test();
LAB_00111bb8:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bbd;
  snapshot_with_uncomitted_data_test();
LAB_00111bbd:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bc2;
  snapshot_with_uncomitted_data_test();
LAB_00111bc2:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bc7;
  snapshot_with_uncomitted_data_test();
LAB_00111bc7:
  pfStack_3d0 = (fdb_kvs_handle *)0x111bcc;
  snapshot_with_uncomitted_data_test();
LAB_00111bcc:
  pfStack_3d0 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf1;
  pfStack_3f8 = pfVar7;
  pfStack_3f0 = (fdb_kvs_handle *)unaff_R12;
  pfStack_3e8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_3e0 = (fdb_kvs_handle *)pcVar20;
  pfStack_3d8 = (fdb_kvs_handle *)unaff_R15;
  pfStack_3d0 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)(auStack_8a0 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf6;
  memleak_start();
  pcVar20 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c05;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar22 = &fStack_4f0;
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
  fdb_get_default_config();
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c1f;
  fdb_get_default_kvs_config();
  fStack_4f0.buffercache_size = 0;
  fStack_4f0.wal_threshold = 0x400;
  fStack_4f0.flags = 1;
  fStack_4f0.compaction_threshold = '\0';
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c44;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c58;
  fVar4 = fdb_open(&pfStack_908,"./mvcc_test1",pfVar22);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c74;
    fVar4 = fdb_kvs_open_default(pfStack_908,&pfStack_918,&fStack_8b8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112359;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c8d;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011235e;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ca4;
    fdb_get_kvs_info(pfStack_910,&fStack_8e8);
    if ((fdb_config *)fStack_8e8.last_seqnum != (fdb_config *)0x0) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cb4;
      in_memory_snapshot_test();
    }
    pcVar20 = auStack_900;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cd7;
    fdb_iterator_init(pfStack_910,(fdb_iterator **)pcVar20,(void *)0x0,0,(void *)0x0,0,0);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ce4;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_900._0_8_,(fdb_doc **)(auStack_900 + 8));
    _Var11._M_i = (__int_type)pfVar22;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112363;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
    fdb_iterator_close((fdb_iterator *)auStack_900._0_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d01;
    fdb_kvs_close(pfStack_910);
    lVar19 = 0;
    uVar21 = 0;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d23;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d3f;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      pcVar20 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d5b;
      sprintf(pcVar20,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6e;
      sVar8 = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d79;
      sVar9 = strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d84;
      sVar10 = strlen(pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
      fdb_doc_create((fdb_doc **)(auStack_8a0 + lVar19),acStack_7f0,sVar8,auStack_6f0,sVar9,pcVar20,
                     sVar10);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dbb;
      fdb_set(pfStack_918,*(fdb_doc **)(auStack_8a0 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 5);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ddb;
    fdb_commit(pfStack_908,'\x01');
    uVar21 = 5;
    ppfVar23 = (fdb_doc **)(auStack_8a0 + 0x28);
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e05;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e21;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      pcVar20 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3d;
      sprintf(pcVar20,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e45;
      sVar8 = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e50;
      sVar9 = strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e5b;
      sVar10 = strlen(pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e7b;
      fdb_doc_create(ppfVar23,acStack_7f0,sVar8,auStack_6f0,sVar9,pcVar20,sVar10);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e88;
      fdb_set(pfStack_918,*ppfVar23);
      uVar21 = uVar21 + 1;
      ppfVar23 = ppfVar23 + 1;
    } while (uVar21 != 9);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eb7;
    sprintf(acStack_7f0,"key%d",9);
    unaff_R15 = auStack_6f0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed5;
    sprintf(unaff_R15,"meta%d",9);
    unaff_R12 = auStack_6f0 + 0x100;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ef3;
    sprintf(unaff_R12,"Body%d",9);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f03;
    unaff_R13 = (char *)strlen(acStack_7f0);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f0e;
    unaff_RBP._M_i = strlen(unaff_R15);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f19;
    sVar8 = strlen(unaff_R12);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f34;
    in_RCX = (fdb_kvs_handle *)unaff_R15;
    fdb_doc_create((fdb_doc **)(auStack_8a0 + 0x48),acStack_7f0,(size_t)unaff_R13,unaff_R15,
                   unaff_RBP._M_i,unaff_R12,sVar8);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f41;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4d;
    fdb_commit(pfStack_908,'\0');
    **(undefined1 **)(auStack_8a0._72_8_ + 0x40) = 0x62;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f64;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    _Var11._M_i = *(fdb_seqnum_t *)(auStack_8a0._72_8_ + 0x28);
    pcVar20 = (char *)&fStack_8e8;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f7d;
    fdb_get_kvs_info(pfStack_918,(fdb_kvs_info *)pcVar20);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f90;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,fStack_8e8.last_seqnum);
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00112368;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fb4;
    pfStack_8f0 = (fdb_config *)_Var11._M_i;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011236d;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc8;
    fdb_commit(pfStack_908,'\0');
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fe6;
    fdb_commit(pfStack_908,'\0');
    uVar21 = 10;
    pcVar20 = (char *)0x50;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11200d;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112029;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      unaff_R12 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112045;
      sprintf(unaff_R12,"body%d",uVar21 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_8a0 + (long)pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112058;
      _Var11._M_i = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112063;
      unaff_R13 = (char *)strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206e;
      sVar8 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)auStack_6f0;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112093;
      fdb_doc_create((fdb_doc **)unaff_RBP._M_i,acStack_7f0,_Var11._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar8);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120a5;
      fdb_set(pfStack_918,*(fdb_doc **)(auStack_8a0 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      pcVar20 = (char *)((long)pcVar20 + 8);
    } while (uVar21 != 0xf);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120ce;
    fVar4 = fdb_set_log_callback(pfStack_918,logCallbackFunc,"in_memory_snapshot_test");
    unaff_R15 = (char *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112372;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120e8;
    fdb_get_kvs_info(pfStack_910,&fStack_8e8);
    if ((fdb_config *)fStack_8e8.last_seqnum != pfStack_8f0) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120fd;
      in_memory_snapshot_test();
    }
    uVar21 = 0xf;
    pfVar22 = (fdb_config *)(auStack_8a0 + 0x78);
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112125;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112140;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_6f0 + 0x100);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215b;
      sprintf((char *)unaff_RBP._M_i,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112163;
      unaff_R15 = (char *)strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216e;
      unaff_R12 = (char *)strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112179;
      sVar8 = strlen((char *)unaff_RBP._M_i);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112199;
      fdb_doc_create((fdb_doc **)pfVar22,acStack_7f0,(size_t)unaff_R15,auStack_6f0,(size_t)unaff_R12
                     ,(void *)unaff_RBP._M_i,sVar8);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a6;
      fdb_set(pfStack_918,*(fdb_doc **)pfVar22);
      uVar21 = uVar21 + 1;
      pfVar22 = (fdb_config *)((long)pfVar22 + 8);
    } while (uVar21 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121c6;
    fdb_commit(pfStack_908,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121e6;
    fdb_iterator_init(pfStack_910,(fdb_iterator **)auStack_900,(void *)0x0,0,(void *)0x0,0,0);
    pcVar20 = auStack_900 + 8;
    auStack_900._8_8_ = (fdb_config *)0x0;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ff;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_900._0_8_,(fdb_doc **)pcVar20);
      _Var11._M_i = auStack_900._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00112339:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11233e;
        in_memory_snapshot_test();
LAB_0011233e:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112349;
        in_memory_snapshot_test();
LAB_00112349:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112354;
        in_memory_snapshot_test();
        goto LAB_00112354;
      }
      unaff_R15 = *(char **)(auStack_900._8_8_ + 0x20);
      unaff_RBP._M_i = *(__int_type *)(auStack_8a0 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->op_stats;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222a;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(size_t *)auStack_900._8_8_);
      pfVar22 = (fdb_config *)_Var11._M_i;
      if (iVar5 != 0) {
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112339;
        in_memory_snapshot_test();
        goto LAB_00112339;
      }
      unaff_R15 = *(char **)(_Var11._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->staletree;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112249;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var11._M_i + 8));
      if (iVar5 != 0) goto LAB_00112349;
      unaff_R15 = *(char **)(_Var11._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_RBP._M_i)->field_6).seqtree;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112268;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var11._M_i + 0x10));
      if (iVar5 != 0) goto LAB_0011233e;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112278;
      fdb_doc_free((fdb_doc *)_Var11._M_i);
      auStack_900._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11228e;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_900._0_8_);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122ab;
      fdb_iterator_close((fdb_iterator *)auStack_900._0_8_);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122b5;
      fdb_kvs_close(pfStack_918);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122bf;
      fdb_kvs_close(pfStack_910);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122c9;
      fdb_close(pfStack_908);
      lVar19 = 0;
      do {
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122d8;
        fdb_doc_free(*(fdb_doc **)(auStack_8a0 + lVar19 * 8));
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x14);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122e6;
      fdb_shutdown();
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122eb;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11231c;
      fprintf(_stderr,pcVar20,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112354:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112359;
    in_memory_snapshot_test();
LAB_00112359:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11235e;
    in_memory_snapshot_test();
LAB_0011235e:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112363;
    in_memory_snapshot_test();
    _Var11._M_i = (__int_type)pfVar22;
LAB_00112363:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112368;
    in_memory_snapshot_test();
LAB_00112368:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11236d;
    in_memory_snapshot_test();
LAB_0011236d:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112372;
    in_memory_snapshot_test();
LAB_00112372:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112377;
    in_memory_snapshot_test();
  }
  aStack_928.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle = (char *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x11239f;
  pfStack_950 = (fdb_kvs_info *)pcVar20;
  aStack_948.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_940 = (fdb_kvs_handle *)unaff_R13;
  aStack_938.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
  pfStack_930 = (fdb_kvs_handle *)unaff_R15;
  aStack_928.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_RBP._M_i;
  gettimeofday(&tStack_a78,(__timezone_ptr_t)0x0);
  pfStack_b50 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  aStack_b30.seqtree = (btree *)0x0;
  pcVar20 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_b50 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)&fStack_a68.seqtree_opt;
  pfStack_b50 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_b50 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  fStack_a68.compaction_minimum_filesize = 0x400;
  fStack_a68._68_4_ = 1;
  fStack_a68.prefetch_duration._7_1_ = '\0';
  fStack_a68.breakpad_minidump_dir = (char *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b50 = (fdb_kvs_handle *)0x11240a;
  fVar4 = fdb_open(&pfStack_b38,"./mvcc_test1",(fdb_config *)pfVar12);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_b50 = (fdb_kvs_handle *)0x112426;
    fVar4 = fdb_kvs_open_default(pfStack_b38,&pfStack_b40,&fStack_af0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_b50 = (fdb_kvs_handle *)0x112446;
    fVar4 = fdb_set_log_callback(pfStack_b40,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar20 = (char *)aaStack_a98;
    aaStack_a98[0]._0_4_ = 0x79656b;
    pfVar12 = (fdb_kvs_handle *)&fStack_ab8;
    fStack_ab8._4_1_ = 0;
    fStack_ab8.create_if_missing = true;
    fStack_ab8._1_3_ = 0x617465;
    handle = &fStack_ad8.create_if_missing;
    fStack_ad8._4_1_ = 0;
    fStack_ad8.create_if_missing = true;
    fStack_ad8._1_3_ = 0x79646f;
    pfStack_b50 = (fdb_kvs_handle *)0x112489;
    unaff_R12 = (char *)strlen(pcVar20);
    pfStack_b50 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar12);
    pfStack_b50 = (fdb_kvs_handle *)0x11249f;
    sVar8 = strlen(handle);
    unaff_RBP._M_i = (__int_type)&aStack_b30;
    pfStack_b50 = (fdb_kvs_handle *)0x1124bf;
    in_RCX = pfVar12;
    fdb_doc_create((fdb_doc **)unaff_RBP._M_i,pcVar20,(size_t)unaff_R12,pfVar12,(size_t)unaff_R13,
                   handle,sVar8);
    pfStack_b50 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    pfStack_b50 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(pfStack_b38,'\0');
    pfStack_b50 = (fdb_kvs_handle *)0x1124ef;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b10,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_b50 = (fdb_kvs_handle *)0x112506;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_b50 = (fdb_kvs_handle *)0x11251a;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_b50 = (fdb_kvs_handle *)0x112538;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b18,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_b50 = (fdb_kvs_handle *)0x11254f;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_b50 = (fdb_kvs_handle *)0x112563;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_b50 = (fdb_kvs_handle *)0x11257a;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_b50 = (fdb_kvs_handle *)0x11258e;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar20 = (char *)&aStack_b30;
    pfStack_b50 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free((fdb_doc *)aStack_b30.seqtree);
    pfVar12 = (fdb_kvs_handle *)&fStack_a68;
    fStack_a68.chunksize = 0x654b;
    fStack_a68._2_2_ = 0x79;
    pfStack_b50 = (fdb_kvs_handle *)0x1125ba;
    handle = (char *)strlen((char *)pfVar12);
    unaff_R12 = &fStack_ab8.create_if_missing;
    pfStack_b50 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP._M_i = (__int_type)&fStack_ad8;
    pfStack_b50 = (fdb_kvs_handle *)0x1125dd;
    sVar8 = strlen((char *)unaff_RBP._M_i);
    pfStack_b50 = (fdb_kvs_handle *)0x1125f8;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar20,pfVar12,(size_t)handle,unaff_R12,(size_t)unaff_R13,
                   (void *)unaff_RBP._M_i,sVar8);
    pfStack_b50 = (fdb_kvs_handle *)0x112605;
    fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    pfStack_b50 = (fdb_kvs_handle *)0x11261b;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b20,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar20 = (char *)aaStack_a98;
    pfStack_b50 = (fdb_kvs_handle *)0x112633;
    sVar8 = strlen(pcVar20);
    pfVar12 = (fdb_kvs_handle *)&pfStack_b28;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar12,pcVar20,sVar8,(void *)0x0,0,(void *)0x0,0);
    pfStack_b50 = (fdb_kvs_handle *)0x112663;
    fVar4 = fdb_get(pfStack_b10,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_b50 = (fdb_kvs_handle *)0x11267a;
    fVar4 = fdb_get(pfStack_b18,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_b50 = (fdb_kvs_handle *)0x112691;
    fVar4 = fdb_get(pfStack_b20,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_b50 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(pfStack_b28);
    pfStack_b50 = (fdb_kvs_handle *)0x1126b7;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_af8,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_b50 = (fdb_kvs_handle *)0x1126d3;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b00,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_b50 = (fdb_kvs_handle *)0x1126ef;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b08,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_b50 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(pfStack_b10);
    pfStack_b50 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(pfStack_b18);
    pfStack_b50 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(pfStack_b20);
    pfStack_b50 = (fdb_kvs_handle *)0x112724;
    fVar4 = fdb_commit(pfStack_b38,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_b50 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(pfStack_af8);
      pfStack_b50 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(pfStack_b00);
      pfStack_b50 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(pfStack_b08);
      pfStack_b50 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(pfStack_b40);
      pfStack_b50 = (fdb_kvs_handle *)0x11275e;
      fdb_close(pfStack_b38);
      pfStack_b50 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free((fdb_doc *)aStack_b30.seqtree);
      pfStack_b50 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_b50 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_b50 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar20,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_b50 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_b50 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_b50 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_b50 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_b50 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_b50 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_b50 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_b50 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_b50 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_b50 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_b50 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_b50 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_b50 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_b50 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_b50 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_b50 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_b50 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_b50 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_b50 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_f18 = (fdb_kvs_handle *)0x112834;
  paStack_b78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar20;
  pfStack_b70 = (fdb_kvs_handle *)unaff_R12;
  pfStack_b68 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b60 = pfVar12;
  pfStack_b58 = (fdb_kvs_handle *)handle;
  pfStack_b50 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_e90,(__timezone_ptr_t)0x0);
  pfStack_c80 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_c78,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_f18 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_c80);
  pfStack_f18 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_f18 = (fdb_kvs_handle *)0x11286b;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pcVar20 = auStack_e80 + 0x108;
  pfStack_f18 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_d58._0_1_ = true;
  uStack_d58._1_1_ = true;
  uStack_d60 = '\x01';
  pcStack_d68 = (char *)0x3c;
  uStack_d38 = 1;
  sStack_d70 = 0;
  pfStack_f18 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_f18 = (fdb_kvs_handle *)0x1128bd;
  fVar4 = fdb_open(&pfStack_ec8,"./mvcc_test",(fdb_config *)pcVar20);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_eb0 + 8);
    pfStack_f18 = (fdb_kvs_handle *)0x1128e0;
    fVar4 = fdb_kvs_open(pfStack_ec8,&pfStack_ee0,"db",(fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
    puStack_ee8 = (undefined4 *)((long)&pfVar12->kvs + 2);
    pcVar20 = "k%05d";
    handle = auStack_e80;
    unaff_R12 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_f18 = (fdb_kvs_handle *)0x11291b;
      sprintf(handle,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112949;
      sprintf((char *)pfVar12,"value%08d",unaff_RBP._M_i);
      unaff_R13 = (char *)pfStack_ee0;
      pfStack_f18 = (fdb_kvs_handle *)0x112956;
      sVar8 = strlen(handle);
      pfStack_f18 = (fdb_kvs_handle *)0x11296e;
      in_RCX = pfVar12;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar8 + 1,pfVar12,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113057;
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 0x1e);
    pfStack_f18 = (fdb_kvs_handle *)0x11298c;
    fVar4 = fdb_commit(pfStack_ec8,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
    pfStack_f18 = (fdb_kvs_handle *)0x1129aa;
    fVar4 = fdb_snapshot_open(pfStack_ee0,&pfStack_ef0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
    pfStack_f18 = (fdb_kvs_handle *)0x1129c8;
    fVar4 = fdb_snapshot_open(pfStack_ef0,&pfStack_ed8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
    unaff_RBP._M_i = 0x1e;
    handle = auStack_e80;
    unaff_R12 = "value%08d";
    do {
      pfStack_f18 = (fdb_kvs_handle *)0x1129fa;
      sprintf(handle,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112a28;
      sprintf((char *)pfVar12,"value%08d",unaff_RBP._M_i);
      unaff_R13 = (char *)pfStack_ee0;
      pfStack_f18 = (fdb_kvs_handle *)0x112a35;
      sVar8 = strlen(handle);
      pfStack_f18 = (fdb_kvs_handle *)0x112a4d;
      in_RCX = pfVar12;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar8 + 1,pfVar12,0x20);
      pfVar7 = (fdb_kvs_handle *)"k%05d";
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 300);
    pfStack_f18 = (fdb_kvs_handle *)0x112a7d;
    sprintf((char *)auStack_e80,"k%05d",0x1e);
    handle = (char *)pfStack_ef0;
    pfStack_f18 = (fdb_kvs_handle *)0x112a8a;
    sVar8 = strlen((char *)auStack_e80);
    in_RCX = (fdb_kvs_handle *)auStack_eb0;
    pfStack_f18 = (fdb_kvs_handle *)0x112aa3;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_e80,sVar8 + 1,
                       (void **)in_RCX,&sStack_eb8);
    pfVar7 = pfStack_ed8;
    pcVar20 = (char *)auStack_e80;
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
    handle = auStack_e80;
    pfStack_f18 = (fdb_kvs_handle *)0x112ac0;
    sVar8 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)auStack_eb0;
    pfStack_f18 = (fdb_kvs_handle *)0x112ad9;
    fVar4 = fdb_get_kv(pfVar7,handle,sVar8 + 1,(void **)in_RCX,&sStack_eb8);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
    pfStack_f18 = (fdb_kvs_handle *)0x112aeb;
    fVar4 = fdb_kvs_close(pfStack_ef0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
    pfStack_f18 = (fdb_kvs_handle *)0x112afd;
    fVar4 = fdb_kvs_close(pfStack_ed8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
    pfStack_f18 = (fdb_kvs_handle *)0x112b1b;
    fVar4 = fdb_snapshot_open(pfStack_ee0,&pfStack_ef0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112b43;
    fVar4 = fdb_iterator_init(pfStack_ef0,&pfStack_ef8,(void *)0x0,0,(void *)0x0,0,0);
    pcVar20 = (char *)pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113104;
    unaff_R12 = auStack_e80;
    unaff_R13 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112b74;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      pcVar20 = (char *)pfVar7;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_f18 = (fdb_kvs_handle *)0x112b8f;
      sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112bbd;
      sprintf((char *)pfVar12,"value%08d",unaff_RBP._M_i);
      pfVar7 = pfStack_f08;
      handle = (char *)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112bd4;
      iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00113061;
      handle = (char *)(pfVar7->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112bef;
      iVar5 = bcmp(handle,pfVar12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00113071;
      unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
      pfStack_f18 = (fdb_kvs_handle *)0x112c01;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_f18 = (fdb_kvs_handle *)0x112c0b;
      fVar4 = fdb_iterator_next(pfStack_ef8);
      pcVar20 = (char *)pfVar7;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 300) goto LAB_00113109;
    pfStack_f18 = (fdb_kvs_handle *)0x112c29;
    fVar4 = fdb_iterator_close(pfStack_ef8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
    pfStack_f18 = (fdb_kvs_handle *)0x112c47;
    fVar4 = fdb_snapshot_open(pfStack_ef0,&pfStack_ed8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113113;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112c6f;
    fVar4 = fdb_iterator_init(pfStack_ef0,&pfStack_ef8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113118;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112c97;
    fVar4 = fdb_iterator_init(pfStack_ed8,&pfStack_ec0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112cbf;
    fVar4 = fdb_iterator_init(pfStack_ee0,&pfStack_ed0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113122;
    unaff_R12 = auStack_e80;
    unaff_R13 = "value%08d";
    handle = "k%06d";
    uStack_efc = 0;
    do {
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112cfd;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      uVar15 = uStack_efc;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
      pfStack_f18 = (fdb_kvs_handle *)0x112d1c;
      sprintf(unaff_R12,"k%05d",(ulong)uStack_efc);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112d4a;
      sprintf((char *)pfVar12,"value%08d",(ulong)uVar15);
      pfVar7 = pfStack_f08;
      unaff_RBP._M_i = (__int_type)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112d61;
      iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_0011307c;
      unaff_RBP._M_i = (__int_type)(pfVar7->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112d7c;
      iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
      pcVar20 = (char *)pfVar7;
      if (iVar5 != 0) goto LAB_001130ac;
      pfStack_f18 = (fdb_kvs_handle *)0x112d8c;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112da4;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      pcVar20 = (char *)pfStack_f08;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
      unaff_RBP._M_i = (__int_type)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112dc3;
      iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00113091;
      unaff_RBP._M_i = (__int_type)(((fdb_kvs_handle *)pcVar20)->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112dde;
      iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar12,
                   (size_t)(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001130a1;
      uVar15 = uStack_efc + 1;
      pfStack_f18 = (fdb_kvs_handle *)0x112df4;
      fdb_doc_free((fdb_doc *)pcVar20);
      uStack_efc = uVar15;
      if (uVar15 == 0x3c) {
        pcVar20 = (char *)0x0;
        do {
          pfStack_f18 = (fdb_kvs_handle *)0x112e10;
          sprintf(unaff_R12,"k%06d",pcVar20);
          *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
          *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
          *puStack_ee8 = 0x646e653c;
          pfStack_f18 = (fdb_kvs_handle *)0x112e3f;
          sprintf((char *)pfVar12,"value%08d",pcVar20);
          unaff_RBP._M_i = (__int_type)pfStack_ee0;
          pfStack_f18 = (fdb_kvs_handle *)0x112e4c;
          sVar8 = strlen(unaff_R12);
          pfStack_f18 = (fdb_kvs_handle *)0x112e64;
          in_RCX = pfVar12;
          fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_RBP._M_i,unaff_R12,sVar8 + 1,pfVar12,0x20);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            pfStack_f18 = (fdb_kvs_handle *)0x113057;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00113057;
          }
          uVar15 = (int)pcVar20 + 1;
          pcVar20 = (char *)(ulong)uVar15;
        } while (uVar15 != 3000);
      }
      pfStack_f18 = (fdb_kvs_handle *)0x112e82;
      fVar6 = fdb_iterator_next(pfStack_ef8);
      unaff_RBP._M_i = (__int_type)(uint)fVar6;
      pfStack_f18 = (fdb_kvs_handle *)0x112e8e;
      fVar4 = fdb_iterator_next(pfStack_ec0);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    pfStack_f18 = (fdb_kvs_handle *)0x112e9f;
    in_memory_snapshot_on_dirty_hbtrie_test();
    fVar4 = extraout_EAX;
LAB_00112e9f:
    if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
      if (uStack_efc != 300) goto LAB_00113127;
      pfStack_f18 = (fdb_kvs_handle *)0x112ebf;
      fVar4 = fdb_iterator_close(pfStack_ef8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
      pfStack_f18 = (fdb_kvs_handle *)0x112ed1;
      fVar4 = fdb_iterator_close(pfStack_ec0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113131;
      unaff_R12 = auStack_e80;
      unaff_R13 = "value%08d";
      unaff_RBP._M_i = 0;
      do {
        pfStack_f08 = (fdb_kvs_handle *)0x0;
        pfStack_f18 = (fdb_kvs_handle *)0x112f02;
        fVar4 = fdb_iterator_get(pfStack_ed0,(fdb_doc **)&pfStack_f08);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_f18 = (fdb_kvs_handle *)0x112f1d;
        sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
        *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
        *puStack_ee8 = 0x646e653c;
        pfStack_f18 = (fdb_kvs_handle *)0x112f4b;
        sprintf((char *)pfVar12,"value%08d",unaff_RBP._M_i);
        pcVar20 = (char *)pfStack_f08;
        handle = (char *)pfStack_f08->op_stats;
        pfStack_f18 = (fdb_kvs_handle *)0x112f62;
        iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
        if (iVar5 != 0) goto LAB_001130b7;
        handle = (char *)(((fdb_kvs_handle *)pcVar20)->field_6).seqtree;
        pfStack_f18 = (fdb_kvs_handle *)0x112f7d;
        iVar5 = bcmp(handle,pfVar12,
                     (size_t)(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_001130c7;
        unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
        pfStack_f18 = (fdb_kvs_handle *)0x112f8f;
        fdb_doc_free((fdb_doc *)pcVar20);
        pfStack_f18 = (fdb_kvs_handle *)0x112f99;
        fVar4 = fdb_iterator_next(pfStack_ed0);
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)unaff_RBP._M_i != 300) goto LAB_00113136;
      pfStack_f18 = (fdb_kvs_handle *)0x112fb7;
      fVar4 = fdb_iterator_close(pfStack_ed0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
      pfStack_f18 = (fdb_kvs_handle *)0x112fc9;
      fVar4 = fdb_kvs_close(pfStack_ef0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113140;
      pfStack_f18 = (fdb_kvs_handle *)0x112fdb;
      fVar4 = fdb_kvs_close(pfStack_ed8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113145;
      pfStack_f18 = (fdb_kvs_handle *)0x112fed;
      fVar4 = fdb_close(pfStack_ec8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
      pfStack_f18 = (fdb_kvs_handle *)0x112ffa;
      fVar4 = fdb_shutdown();
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_f18 = (fdb_kvs_handle *)0x11300a;
        free(pfVar12);
        pfStack_f18 = (fdb_kvs_handle *)0x11300f;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_f18 = (fdb_kvs_handle *)0x113040;
        fprintf(_stderr,pcVar20,"in-memory snapshot on dirty HB+trie nodes test");
        return;
      }
      goto LAB_0011314f;
    }
  }
  else {
LAB_001130d2:
    pfStack_f18 = (fdb_kvs_handle *)0x1130d7;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
    pfStack_f18 = (fdb_kvs_handle *)0x1130dc;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
    pfStack_f18 = (fdb_kvs_handle *)0x1130e1;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
    pfStack_f18 = (fdb_kvs_handle *)0x1130e6;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
    pfStack_f18 = (fdb_kvs_handle *)0x1130eb;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
    pfVar7 = (fdb_kvs_handle *)pcVar20;
    pfStack_f18 = (fdb_kvs_handle *)0x1130f0;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
    pfStack_f18 = (fdb_kvs_handle *)0x1130f5;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
    pfStack_f18 = (fdb_kvs_handle *)0x1130fa;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
    pfStack_f18 = (fdb_kvs_handle *)0x1130ff;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
    pfStack_f18 = (fdb_kvs_handle *)0x113104;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar20 = (char *)pfVar7;
LAB_00113104:
    pfStack_f18 = (fdb_kvs_handle *)0x113109;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
    pfStack_f18 = (fdb_kvs_handle *)0x11310e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
    pfStack_f18 = (fdb_kvs_handle *)0x113113;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
    pfStack_f18 = (fdb_kvs_handle *)0x113118;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
    pfStack_f18 = (fdb_kvs_handle *)0x11311d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
    pfStack_f18 = (fdb_kvs_handle *)0x113122;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
    pfStack_f18 = (fdb_kvs_handle *)0x113127;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
    pfStack_f18 = (fdb_kvs_handle *)0x11312c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
    pfStack_f18 = (fdb_kvs_handle *)0x113131;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
    pfStack_f18 = (fdb_kvs_handle *)0x113136;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
    pfStack_f18 = (fdb_kvs_handle *)0x11313b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
    pfStack_f18 = (fdb_kvs_handle *)0x113140;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
    pfStack_f18 = (fdb_kvs_handle *)0x113145;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
    pfStack_f18 = (fdb_kvs_handle *)0x11314a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
    pfStack_f18 = (fdb_kvs_handle *)0x11314f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
    pfStack_f18 = (fdb_kvs_handle *)0x113154;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_f18 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_1330 = (fdb_kvs_handle *)0x113179;
  pfStack_f40 = pfVar12;
  pfStack_f38 = (fdb_kvs_handle *)unaff_R12;
  pfStack_f30 = (fdb_kvs_handle *)unaff_R13;
  pfStack_f28 = (fdb_kvs_handle *)pcVar20;
  pfStack_f20 = (fdb_kvs_handle *)handle;
  pfStack_f18 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_1258,(__timezone_ptr_t)0x0);
  auStack_1320._4_2_ = 100;
  auStack_1320._0_4_ = 0x3530256b;
  auStack_12f8._8_2_ = 100;
  auStack_12f8._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_1040,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1048 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_1330 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_1048);
  pfStack_1330 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_1330 = (fdb_kvs_handle *)0x1131d5;
  pfVar7 = (fdb_kvs_handle *)malloc(0x20);
  pfVar12 = (fdb_kvs_handle *)((long)apbStack_1248 + 0x108);
  pfStack_1330 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_1120 = 0x201;
  auStack_1140[0x18] = '\x01';
  auStack_1140._16_8_ = (fdb_txn *)0x2;
  uStack_1100 = 1;
  auStack_1140._8_8_ = (fdb_log_callback)0x0;
  pcStack_10e8 = cb_inmem_snap;
  uStack_10e0 = 2;
  pfStack_10d8 = (fdb_txn *)auStack_12c8;
  pfStack_1330 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_1330 = (fdb_kvs_handle *)0x113246;
  fVar4 = fdb_open(&pfStack_1318,"./mvcc_test",(fdb_config *)pfVar12);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_12c8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x11326c;
    fVar4 = fdb_kvs_open(pfStack_1318,(fdb_kvs_handle **)(auStack_12f8 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    in_RCX = (fdb_kvs_handle *)(auStack_12c8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x113292;
    fVar4 = fdb_kvs_open(pfStack_1318,(fdb_kvs_handle **)(auStack_12f8 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_12c8._0_8_ = auStack_12f8._24_8_;
    auStack_12c8._8_8_ = (btree *)0xa;
    auStack_12c8._24_8_ = auStack_1320;
    handle = auStack_12f8;
    auStack_12c8._16_4_ = 0x20;
    pfVar12 = (fdb_kvs_handle *)((long)&pfVar7->kvs + 2);
    unaff_R12 = (char *)apbStack_1248;
    unaff_RBP._M_i = 0;
    auStack_12c8._32_8_ = handle;
    do {
      pfStack_1330 = (fdb_kvs_handle *)0x1132ee;
      sprintf(unaff_R12,auStack_1320,unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar7->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar12->kvs_config = 0x646e653c;
      pfStack_1330 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar7,handle,unaff_RBP._M_i);
      unaff_R13 = (char *)auStack_12f8._16_8_;
      pfStack_1330 = (fdb_kvs_handle *)0x113326;
      sVar8 = strlen(unaff_R12);
      pfStack_1330 = (fdb_kvs_handle *)0x11333e;
      in_RCX = pfVar7;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar8 + 1,pfVar7,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_1330 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 10);
    pfStack_1330 = (fdb_kvs_handle *)0x11335c;
    fVar4 = fdb_commit(pfStack_1318,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_1330 = (fdb_kvs_handle *)0x113375;
    fVar4 = fdb_compact(pfStack_1318,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_1330 = (fdb_kvs_handle *)0x113393;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_12f8._16_8_,&pfStack_1310,0xffffffffffffffff
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_1330 = (fdb_kvs_handle *)0x1133ad;
    fVar4 = fdb_get_kvs_info(pfStack_1310,(fdb_kvs_info *)&phStack_1288);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_1280 != (kvs_ops_stat *)0xb) {
      pfStack_1330 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1330 = (fdb_kvs_handle *)0x1133ed;
    fVar4 = fdb_iterator_init(pfStack_1310,&pfStack_1300,(void *)0x0,0,(void *)0x0,0,0);
    pfVar18 = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle = (char *)apbStack_1248;
    unaff_RBP._M_i = 0;
    do {
      pfStack_1308 = (fdb_kvs_handle *)0x0;
      pfStack_1330 = (fdb_kvs_handle *)0x113417;
      fVar4 = fdb_iterator_get(pfStack_1300,(fdb_doc **)&pfStack_1308);
      unaff_R12 = (char *)pfStack_1308;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP._M_i < 10) {
        pfStack_1330 = (fdb_kvs_handle *)0x113435;
        sprintf(handle,auStack_1320,unaff_RBP._M_i);
        *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)((long)&pfVar7->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar12->kvs_config = 0x646e653c;
        pfStack_1330 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar7,auStack_12f8,unaff_RBP._M_i);
        unaff_R12 = (char *)pfStack_1308;
        unaff_R13 = (char *)pfStack_1308->op_stats;
        pfStack_1330 = (fdb_kvs_handle *)0x11347b;
        iVar5 = bcmp(unaff_R13,handle,*(size_t *)&pfStack_1308->kvs_config);
        if (iVar5 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_1330 = (fdb_kvs_handle *)0x113498;
        iVar5 = bcmp(unaff_R13,pfVar7,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_1248[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(undefined8 *)&pfVar7->kvs_config = 0x756c61765f77656e;
        *(undefined2 *)&(pfVar7->kvs_config).custom_cmp = 0x65;
        unaff_R13 = (char *)pfStack_1308->op_stats;
        pfStack_1330 = (fdb_kvs_handle *)0x1134df;
        iVar5 = bcmp(unaff_R13,handle,*(size_t *)&pfStack_1308->kvs_config);
        if (iVar5 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_1330 = (fdb_kvs_handle *)0x1134fc;
        iVar5 = bcmp(unaff_R13,pfVar7,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113624;
      }
      unaff_RBP._M_i = (__int_type)((uint)unaff_RBP._M_i + 1);
      pfStack_1330 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfStack_1330 = (fdb_kvs_handle *)0x113518;
      fVar4 = fdb_iterator_next(pfStack_1300);
      pfVar18 = (fdb_kvs_handle *)unaff_R12;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 0xb) goto LAB_00113672;
    pfStack_1330 = (fdb_kvs_handle *)0x113533;
    fVar4 = fdb_iterator_close(pfStack_1300);
    pfVar13 = pfStack_1310;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle = (char *)apbStack_1248;
    pfStack_1330 = (fdb_kvs_handle *)0x113550;
    sVar8 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_12f8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x113569;
    fVar4 = fdb_get_kv(pfVar13,handle,sVar8 + 1,(void **)in_RCX,(size_t *)(auStack_12f8 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_1330 = (fdb_kvs_handle *)0x113586;
    pfVar12 = pfVar7;
    iVar5 = bcmp((void *)auStack_12f8._40_8_,pfVar7,auStack_12f8._32_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_12f8._40_8_;
    if (iVar5 != 0) goto LAB_00113681;
    pfStack_1330 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_12f8._40_8_);
    pfStack_1330 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_1310);
    pfStack_1330 = (fdb_kvs_handle *)0x1135aa;
    fVar4 = fdb_close(pfStack_1318);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_1330 = (fdb_kvs_handle *)0x1135b7;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1330 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar7);
      pfStack_1330 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_1330 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar20,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_1330 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_1330 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_1330 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_1330 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_1330 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_1330 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_1330 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    pfVar18 = (fdb_kvs_handle *)unaff_R12;
LAB_0011366d:
    pfStack_1330 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_1330 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar13 = pfVar12;
    pfStack_1330 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_1330 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_1330 = (fdb_kvs_handle *)0x11368c;
    pfVar12 = pfVar13;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_1330 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_1330 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar21 = (ulong)pfVar12 & 0xffffffff;
  _Var11._M_i = 0;
  pcStack_15e8 = (code *)0x1136be;
  pfStack_1358 = pfVar7;
  pfStack_1350 = pfVar18;
  pfStack_1348 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1340 = pfVar13;
  pfStack_1338 = (fdb_kvs_handle *)handle;
  pfStack_1330 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)auStack_1570,(__timezone_ptr_t)0x0);
  if ((int)pfVar12 != 2) {
    return;
  }
  __s = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_15e8 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_15e8 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_15e8 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_15e8 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_15e8 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_15e8 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_15e8 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar12 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_15e8 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar7 = in_RCX;
    pcStack_15e8 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_15e8 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_))
    ;
    pfVar12 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(((atomic<unsigned_long> *)
                             &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                            super___atomic_base<unsigned_long>)._M_i + 4);
    *(int *)((long)&(((atomic<unsigned_long> *)
                     &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                    super___atomic_base<unsigned_long>)._M_i + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_15e8 = (code *)0x11370e;
      fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                                *(__atomic_base<unsigned_long> *)
                                 &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_15d0,
                                0xffffffffffffffff);
      _Var11._M_i = (__int_type)pfVar12;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_15e8 = (code *)0x113725;
      fVar4 = fdb_get_kvs_info(pfStack_15d0,&fStack_15a0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_15a0.last_seqnum !=
          (long)(int)(((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                     super___atomic_base<unsigned_long>)._M_i) {
        pcStack_15e8 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_15e8 = (code *)0x11376a;
      pfStack_15c0 = pfVar12;
      paStack_15b8 = (atomic<unsigned_long> *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_15d0,&pfStack_15d8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        __s = (btree *)(auStack_1570 + 10);
        uVar21 = 0;
        do {
          pfStack_15c8 = (fdb_kvs_handle *)0x0;
          pcStack_15e8 = (code *)0x1137a1;
          fVar4 = fdb_iterator_get(pfStack_15d8,(fdb_doc **)&pfStack_15c8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar19 = CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_));
          pcStack_15e8 = (code *)0x1137c1;
          sprintf(auStack_1560 + 0x100,*(char **)(lVar19 + 0x18),uVar21);
          sVar8 = (size_t)*(int *)(lVar19 + 0x10);
          pcStack_15e8 = (code *)0x1137d5;
          memset(auStack_1560,0x78,sVar8);
          *(undefined4 *)(&__s->ksize + sVar8) = 0x646e653c;
          *(undefined2 *)((long)&uStack_1562 + sVar8) = 0x3e;
          pcStack_15e8 = (code *)0x1137f5;
          sprintf(auStack_1560,*(char **)(lVar19 + 0x20),uVar21);
          unaff_R13 = (char *)pfStack_15c8;
          in_RCX = (fdb_kvs_handle *)pfStack_15c8->op_stats;
          pcStack_15e8 = (code *)0x11380d;
          iVar5 = bcmp(in_RCX,auStack_1560 + 0x100,*(size_t *)&pfStack_15c8->kvs_config);
          if (iVar5 != 0) {
            pcStack_15e8 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_15e8 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (fdb_kvs_handle *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_15e8 = (code *)0x113828;
          iVar5 = bcmp(in_RCX,auStack_1560,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113b90;
          uVar21 = (ulong)((int)uVar21 + 1);
          pcStack_15e8 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_15e8 = (code *)0x113844;
          fVar4 = fdb_iterator_next(pfStack_15d8);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar21 != (int)(paStack_15b8->super___atomic_base<unsigned_long>)._M_i) {
          pcStack_15e8 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_15e8 = (code *)0x113863;
        fVar4 = fdb_iterator_close(pfStack_15d8);
        pfVar12 = pfStack_15c0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_15e8 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = (fdb_kvs_handle *)(auStack_1560 + 0x100);
    auStack_1560._256_4_ = 0x5f77656e;
    auStack_1560[0x104] = 'k';
    auStack_1560[0x105] = 'e';
    auStack_1560[0x106] = 'y';
    auStack_1560[0x107] = '\0';
    __s = (btree *)auStack_1560;
    auStack_1560[0] = 'n';
    auStack_1560[1] = 'e';
    auStack_1560._2_2_ = 0x5f77;
    auStack_1560._4_4_ = 0x756c6176;
    auStack_1560._8_2_ = 0x65;
    _Var11._M_i = *(__int_type *)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_15e8 = (code *)0x1138b7;
    pfStack_15c0 = pfVar12;
    sVar8 = strlen((char *)in_RCX);
    pfVar18 = (fdb_kvs_handle *)(sVar8 + 1);
    pcStack_15e8 = (code *)0x1138c3;
    sVar8 = strlen((char *)__s);
    pcStack_15e8 = (code *)0x1138d8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)_Var11._M_i,in_RCX,(size_t)pfVar18,__s,sVar8 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_15e8 = (code *)0x1138f5;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                              *(__atomic_base<unsigned_long> *)
                               &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_15d0,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_15e8 = (code *)0x11390c;
    fVar4 = fdb_get_kvs_info(pfStack_15d0,&fStack_15a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_15a0.last_seqnum !=
        (long)(int)(((atomic<unsigned_long> *)
                    &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 1U) {
      pcStack_15e8 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_15e8 = (code *)0x11394a;
    fVar4 = fdb_iterator_init(pfStack_15d0,&pfStack_15d8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar12 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar20 = auStack_1560 + 0x100;
    pfVar18 = (fdb_kvs_handle *)auStack_1560;
    uVar21 = 0;
    do {
      pfStack_15c8 = (fdb_kvs_handle *)0x0;
      pcStack_15e8 = (code *)0x11397c;
      fVar4 = fdb_iterator_get(pfStack_15d8,(fdb_doc **)&pfStack_15c8);
      unaff_R13 = (char *)pfStack_15c8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar21 <
          (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i) {
        lVar19 = CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_));
        pcStack_15e8 = (code *)0x1139a4;
        sprintf(pcVar20,*(char **)(lVar19 + 0x18),uVar21);
        sVar8 = (size_t)*(int *)(lVar19 + 0x10);
        pcStack_15e8 = (code *)0x1139b8;
        memset(pfVar18,0x78,sVar8);
        *(undefined4 *)(auStack_1570 + sVar8 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_1562 + sVar8) = 0x3e;
        pcStack_15e8 = (code *)0x1139dd;
        sprintf((char *)pfVar18,*(char **)(lVar19 + 0x20),uVar21);
        unaff_R13 = (char *)pfStack_15c8;
        __s = (btree *)(((atomic<unsigned_long> *)&pfStack_15c8->op_stats)->
                       super___atomic_base<unsigned_long>)._M_i;
        pcStack_15e8 = (code *)0x1139f5;
        iVar5 = bcmp(__s,pcVar20,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_15c8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bb0;
        __s = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_15e8 = (code *)0x113a10;
        iVar5 = bcmp(__s,pfVar18,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_1560._256_4_ = 0x5f77656e;
        auStack_1560[0x104] = 'k';
        auStack_1560[0x105] = 'e';
        auStack_1560[0x106] = 'y';
        auStack_1560[0x107] = '\0';
        auStack_1560[0] = 'n';
        auStack_1560[1] = 'e';
        auStack_1560._2_2_ = 0x5f77;
        auStack_1560._4_4_ = 0x756c6176;
        auStack_1560._8_2_ = 0x65;
        __s = (btree *)(((atomic<unsigned_long> *)&pfStack_15c8->op_stats)->
                       super___atomic_base<unsigned_long>)._M_i;
        pcStack_15e8 = (code *)0x113a5f;
        iVar5 = bcmp(__s,pcVar20,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_15c8->kvs_config);
        if (iVar5 != 0) goto LAB_00113bd0;
        __s = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_15e8 = (code *)0x113a7a;
        iVar5 = bcmp(__s,pfVar18,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar5 != 0) goto LAB_00113ba0;
      }
      uVar21 = (ulong)((int)uVar21 + 1);
      pcStack_15e8 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_15e8 = (code *)0x113a96;
      fVar4 = fdb_iterator_next(pfStack_15d8);
      pfVar12 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar21 !=
        (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i + 1) {
      pcStack_15e8 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_15e8 = (code *)0x113ab4;
    fVar4 = fdb_iterator_close(pfStack_15d8);
    _Var11._M_i = (__int_type)pfStack_15c0;
    pfVar7 = pfStack_15d0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s = (btree *)(auStack_1560 + 0x100);
    pcStack_15e8 = (code *)0x113ad6;
    sVar8 = strlen((char *)__s);
    pcStack_15e8 = (code *)0x113aef;
    fVar4 = fdb_get_kv(pfVar7,__s,sVar8 + 1,&pfStack_15a8,&sStack_15b0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_15e8 = (code *)0x113b11;
    iVar5 = bcmp(pfStack_15a8,auStack_1560,sStack_15b0);
    pfVar7 = pfStack_15a8;
    if (iVar5 == 0) {
      pcStack_15e8 = (code *)0x113b21;
      fdb_free_block(pfStack_15a8);
LAB_00113b21:
      pcStack_15e8 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_15d0);
      return;
    }
  }
  pcStack_15e8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1b60 = (fdb_iterator *)0x113c42;
  fStack_1808.bub_ctx.space_used = (uint64_t)pfVar7;
  fStack_1808.bub_ctx.handle = pfVar18;
  pfStack_1600 = pfVar12;
  pbStack_15f8 = __s;
  pfStack_15f0 = (fdb_kvs_handle *)_Var11._M_i;
  pcStack_15e8 = (code *)uVar21;
  gettimeofday(&tStack_1a30,(__timezone_ptr_t)0x0);
  pfStack_1b60 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_1b60 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)&fStack_1808.config.encryption_key;
  pfStack_1b60 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1a20;
  pfStack_1b60 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_1808.config.encryption_key.bytes[4] = '\0';
  fStack_1808.config.encryption_key.bytes[5] = '\0';
  fStack_1808.config.encryption_key.bytes[6] = '\0';
  fStack_1808.config.encryption_key.bytes[7] = '\0';
  fStack_1808.config.encryption_key.bytes[8] = '\0';
  fStack_1808.config.encryption_key.bytes[9] = '\0';
  fStack_1808.config.encryption_key.bytes[10] = '\0';
  fStack_1808.config.encryption_key.bytes[0xb] = '\0';
  fStack_1808.config.encryption_key.bytes[0xc] = '\0';
  fStack_1808.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1808.config.encryption_key.bytes[0xe] = '\0';
  fStack_1808.config.encryption_key.bytes[0xf] = '\0';
  fStack_1808.config.encryption_key.bytes[0x10] = '\0';
  fStack_1808.config.encryption_key.bytes[0x11] = '\0';
  fStack_1808.config.encryption_key.bytes[0x12] = '\0';
  fStack_1808.config.encryption_key.bytes[0x13] = '\0';
  fStack_1808.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1808.config._180_4_ = 1;
  fStack_1808.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1b60 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar7 = (fdb_kvs_handle *)(auStack_1b40 + 0x10);
  pfStack_1b60 = (fdb_iterator *)0x113cb7;
  fVar4 = fdb_open((fdb_file_handle **)pfVar7,"./mvcc_test1",(fdb_config *)pfVar13);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1b60 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1b40._16_8_,&pfStack_1b50,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1b60 = (fdb_iterator *)0x113ce2;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_1b60 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1b40._8_8_,(fdb_kvs_info *)(apfStack_1a90 + 6));
    if ((fdb_kvs_handle *)fStack_1a60.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1b60 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar7 = (fdb_kvs_handle *)auStack_1b40;
    pfStack_1b60 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1b40._8_8_,(fdb_iterator **)pfVar7,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1b60 = (fdb_iterator *)0x113d3a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
    pfVar14 = pfVar18;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_1b60 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
    pfStack_1b60 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1b40._8_8_);
    lVar19 = 0;
    uVar21 = 0;
    do {
      pfStack_1b60 = (fdb_iterator *)0x113d79;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_1808,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113dc1;
      sVar8 = strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x113dcc;
      sVar9 = strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x113dd7;
      sVar10 = strlen((char *)&fStack_1808);
      pfStack_1b60 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_1b08 + lVar19),auStack_1a20 + 0x18,sVar8,&fStack_1908,
                     sVar9,&fStack_1808,sVar10);
      pfStack_1b60 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_1b50,*(fdb_doc **)(auStack_1b08 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 5);
    pfStack_1b60 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\x01');
    uVar21 = 5;
    ppfVar23 = (fdb_doc **)(auStack_1b08 + 0x28);
    do {
      pfStack_1b60 = (fdb_iterator *)0x113e52;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_1808,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113e92;
      sVar8 = strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x113e9d;
      sVar9 = strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x113ea8;
      sVar10 = strlen((char *)&fStack_1808);
      pfStack_1b60 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(ppfVar23,auStack_1a20 + 0x18,sVar8,&fStack_1908,sVar9,&fStack_1808,sVar10);
      pfStack_1b60 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_1b50,*ppfVar23);
      uVar21 = uVar21 + 1;
      ppfVar23 = ppfVar23 + 1;
    } while (uVar21 != 9);
    pfVar13 = (fdb_kvs_handle *)(auStack_1a20 + 0x18);
    pfStack_1b60 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar13,"key%d",9);
    config = &fStack_1908;
    pfStack_1b60 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar14 = &fStack_1808;
    pfStack_1b60 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar14,"Body%d",9);
    pfVar7 = (fdb_kvs_handle *)(auStack_1b08 + 0x48);
    pfStack_1b60 = (fdb_iterator *)0x113f50;
    pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar13);
    pfStack_1b60 = (fdb_iterator *)0x113f5b;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_1b60 = (fdb_iterator *)0x113f66;
    sVar8 = strlen((char *)pfVar14);
    pfStack_1b60 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar13,(size_t)pfVar12,config,(size_t)doc_00,pfVar14,sVar8);
    pfStack_1b60 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    **(undefined1 **)(auStack_1b08._72_8_ + 0x40) = 0x62;
    pfStack_1b60 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    pfStack_1b20 = *(fdb_kvs_handle **)(auStack_1b08._72_8_ + 0x28);
    pfStack_1b60 = (fdb_iterator *)0x113fdf;
    fVar4 = fdb_snapshot_open(pfStack_1b50,&pfStack_1b10,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_1b60 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    uVar21 = 10;
    pfVar7 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1b60 = (fdb_iterator *)0x11402c;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfVar14 = &fStack_1808;
      pfStack_1b60 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar14,"body%d",uVar21 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_1b08 + (long)pfVar7);
      pfStack_1b60 = (fdb_iterator *)0x114074;
      pfVar13 = (fdb_kvs_handle *)strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x11407f;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x11408a;
      sVar8 = strlen((char *)pfVar14);
      pfStack_1b60 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_00,auStack_1a20 + 0x18,(size_t)pfVar13,&fStack_1908,
                     (size_t)pfVar12,pfVar14,sVar8);
      pfStack_1b60 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_1b50,*(fdb_doc **)(auStack_1b08 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 8);
    } while (uVar21 != 0xf);
    pfStack_1b60 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\x01');
    pfStack_1b60 = (fdb_iterator *)0x1140f6;
    fVar4 = fdb_set_log_callback(pfStack_1b50,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_1b60 = (fdb_iterator *)0x114112;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),999999);
    pfVar13 = pfStack_1b20;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_1b60 = (fdb_iterator *)0x114132;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),
                              (fdb_seqnum_t)pfStack_1b20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_1b60 = (fdb_iterator *)0x11414c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1b40._8_8_,&pfStack_1b28,
                              (fdb_seqnum_t)pfVar13);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_1b60 = (fdb_iterator *)0x11415e;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1b40._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_1b60 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_1b28,(fdb_kvs_info *)(apfStack_1a90 + 6));
    if ((fdb_kvs_handle *)fStack_1a60.last_seqnum != pfVar13) {
      pfStack_1b60 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar21 = 0xf;
    config = (fdb_iterator *)apfStack_1a90;
    do {
      pfStack_1b60 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      doc_00 = &fStack_1908;
      pfStack_1b60 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_00,"meta%d",uVar21 & 0xffffffff);
      pfVar13 = &fStack_1808;
      pfStack_1b60 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar13,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x1141f7;
      pfVar14 = (fdb_kvs_handle *)strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x114202;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_1b60 = (fdb_iterator *)0x11420d;
      sVar8 = strlen((char *)pfVar13);
      pfStack_1b60 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_1a20 + 0x18,(size_t)pfVar14,doc_00,(size_t)pfVar12,
                     pfVar13,sVar8);
      pfStack_1b60 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_1b50,*(fdb_doc **)config);
      uVar21 = uVar21 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar21 != 0x14);
    pfStack_1b60 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    pfStack_1b60 = (fdb_iterator *)0x11426d;
    fVar4 = fdb_snapshot_open(pfStack_1b10,&pfStack_1b18,0xffffffffffffffff);
    pfVar7 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar7 = (fdb_kvs_handle *)&pfStack_1b48;
    pfStack_1b60 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar7,
                   (void *)(*(size_t **)
                             (auStack_1b08 + (((long)pfStack_1b20 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_1b08 + (((long)pfStack_1b20 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1b60 = (fdb_iterator *)0x1142c5;
    fVar4 = fdb_get_metaonly(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_1b60 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_1b48);
    pfStack_1b60 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_1b48,*(kvs_ops_stat **)(auStack_1b08._40_8_ + 0x20),
                   *(size_t *)(fdb_kvs_config *)auStack_1b08._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b60 = (fdb_iterator *)0x11430c;
    fVar4 = fdb_get_metaonly(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    pfVar18 = (fdb_kvs_handle *)auStack_1b08._40_8_;
    doc_01 = pfStack_1b48;
    pfVar7 = (fdb_kvs_handle *)&pfStack_1b48;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar13 = (fdb_kvs_handle *)pfStack_1b48->op_stats;
    config = *(fdb_iterator **)(auStack_1b08._40_8_ + 0x20);
    pfStack_1b60 = (fdb_iterator *)0x114336;
    iVar5 = bcmp(pfVar13,config,*(size_t *)(fdb_kvs_config *)auStack_1b08._40_8_);
    if (iVar5 != 0) goto LAB_001146d4;
    pfVar13 = (fdb_kvs_handle *)doc_01->staletree;
    config = *(fdb_iterator **)((long)pfVar18 + 0x38);
    pfStack_1b60 = (fdb_iterator *)0x114357;
    iVar5 = bcmp(pfVar13,config,(size_t)(pfVar18->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_001146df;
    pfStack_1b60 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_1b60 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_1b48,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b48->fhandle = (fdb_file_handle *)0x6;
    pfStack_1b60 = (fdb_iterator *)0x11439d;
    fVar4 = fdb_get_byseq(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    pfVar7 = pfStack_1b48;
    doc_01 = (fdb_kvs_handle *)&pfStack_1b48;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar13 = (fdb_kvs_handle *)pfStack_1b48->op_stats;
    config = *(fdb_iterator **)(auStack_1b08._40_8_ + 0x20);
    pfStack_1b60 = (fdb_iterator *)0x1143c6;
    iVar5 = bcmp(pfVar13,config,*(size_t *)&pfStack_1b48->kvs_config);
    pfVar18 = (fdb_kvs_handle *)auStack_1b08._40_8_;
    if (iVar5 != 0) goto LAB_001146ef;
    pfVar13 = (fdb_kvs_handle *)(pfVar7->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1b08._40_8_ + 0x40))->
             seqtree;
    pfStack_1b60 = (fdb_iterator *)0x1143e6;
    iVar5 = bcmp(pfVar13,config,(size_t)(pfVar7->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001146fa;
    pfStack_1b60 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfVar7 = (fdb_kvs_handle *)&pfStack_1b48;
    pfStack_1b48 = (fdb_kvs_handle *)0x0;
    pfVar12 = (fdb_kvs_handle *)0x0;
    pfStack_1b60 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_1b28,(fdb_iterator **)auStack_1b40,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = pfVar13;
    do {
      pfStack_1b60 = (fdb_iterator *)0x114432;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b40._0_8_,(fdb_doc **)pfVar7);
      pfVar13 = pfStack_1b48;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_1b60 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar13 = pfVar14;
LAB_0011465c:
        pfStack_1b60 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_1b60 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config = (fdb_iterator *)pfStack_1b48->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_1b08 + (long)pfVar12 * 8);
      pfVar18 = (fdb_kvs_handle *)doc_00->_seqnum;
      pfStack_1b60 = (fdb_iterator *)0x11445a;
      iVar5 = bcmp(config,pfVar18,*(size_t *)&pfStack_1b48->kvs_config);
      pfVar14 = pfVar13;
      if (iVar5 != 0) {
        pfStack_1b60 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)pfVar13->staletree;
      pfVar18 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
      pfStack_1b60 = (fdb_iterator *)0x114479;
      iVar5 = bcmp(config,pfVar18,(size_t)(pfVar13->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_00114667;
      config = (fdb_iterator *)(pfVar13->field_6).seqtree;
      pfVar18 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
      pfStack_1b60 = (fdb_iterator *)0x114498;
      iVar5 = bcmp(config,pfVar18,(size_t)(pfVar13->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011465c;
      pfStack_1b60 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar13);
      pfStack_1b48 = (fdb_kvs_handle *)0x0;
      pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
      pfStack_1b60 = (fdb_iterator *)0x1144be;
      pfVar17 = (fdb_iterator *)auStack_1b40._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar12 == 10) {
      pfStack_1b60 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
      pfVar12 = (fdb_kvs_handle *)0x0;
      pfStack_1b60 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_1b18,(fdb_iterator **)auStack_1b40,(void *)0x0,0,(void *)0x0,0,0);
      pfVar7 = (fdb_kvs_handle *)&pfStack_1b48;
      do {
        pfStack_1b60 = (fdb_iterator *)0x114510;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b40._0_8_,(fdb_doc **)pfVar7);
        pfVar13 = pfStack_1b48;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config = (fdb_iterator *)pfStack_1b48->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_1b08 + (long)pfVar12 * 8);
        pfVar18 = (fdb_kvs_handle *)doc_00->_seqnum;
        pfStack_1b60 = (fdb_iterator *)0x114538;
        iVar5 = bcmp(config,pfVar18,*(size_t *)&pfStack_1b48->kvs_config);
        if (iVar5 != 0) goto LAB_00114672;
        config = (fdb_iterator *)pfVar13->staletree;
        pfVar18 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
        pfStack_1b60 = (fdb_iterator *)0x114557;
        iVar5 = bcmp(config,pfVar18,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_0011468d;
        config = (fdb_iterator *)(pfVar13->field_6).seqtree;
        pfVar18 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
        pfStack_1b60 = (fdb_iterator *)0x114576;
        iVar5 = bcmp(config,pfVar18,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00114682;
        pfStack_1b60 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_1b48 = (fdb_kvs_handle *)0x0;
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
        pfStack_1b60 = (fdb_iterator *)0x11459c;
        pfVar17 = (fdb_iterator *)auStack_1b40._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
        pfVar14 = pfVar13;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar12 == 10) {
        pfStack_1b60 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
        pfStack_1b60 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_1b50);
        pfStack_1b60 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_1b10);
        pfStack_1b60 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_1b18);
        pfStack_1b60 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_1b28);
        pfStack_1b60 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_1b40._16_8_);
        lVar19 = 0;
        do {
          pfStack_1b60 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_1b08 + lVar19 * 8));
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x14);
        pfStack_1b60 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_1b60 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_1b60 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar20,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_1b60 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_1b60 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar14 = pfVar18;
LAB_001146a2:
    pfStack_1b60 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_1b60 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_1b60 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_1b60 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_1b60 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_1b60 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_1b60 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_1b60 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_1b60 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    pfVar18 = pfVar14;
    doc_01 = pfVar7;
    pfStack_1b60 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_1b60 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_1b60 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar7 = doc_01;
    pfStack_1b60 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_1b60 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_1b60 = (fdb_iterator *)0x114705;
    pfVar17 = config;
    snapshot_clone_test();
  }
  pfStack_1b60 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_1b60 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_1bb8 = (fdb_doc *)0x0;
  lVar19 = (((atomic<unsigned_long> *)&pfVar17->handle)->super___atomic_base<unsigned_long>)._M_i;
  iVar5 = *(int *)&(((atomic<unsigned_long> *)&pfVar17->seqtree_iterator)->
                   super___atomic_base<unsigned_long>)._M_i;
  pfStack_1b88 = pfVar7;
  pfStack_1b80 = pfVar18;
  pfStack_1b78 = pfVar12;
  pfStack_1b70 = pfVar13;
  pfStack_1b68 = config;
  pfStack_1b60 = doc_00;
  gettimeofday(&tStack_1b98,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                            (((atomic<unsigned_long> *)&pfVar17->hbtrie_iterator)->
                            super___atomic_base<unsigned_long>)._M_i,&pfStack_1ba0,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar16 = 0;
  iStack_1ba4 = iVar5;
  fdb_iterator_init(pfStack_1ba0,&pfStack_1bb0,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_1bb0,&pfStack_1bb8);
    doc = pfStack_1bb8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_1bb8->key;
    lVar2 = *(long *)(lVar19 + lVar16 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_1bb8->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_1bb8 = (fdb_doc *)0x0;
    lVar16 = lVar16 + 1;
    fVar4 = fdb_iterator_next(pfStack_1bb0);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_1ba4 / 2 == (int)lVar16) {
    fdb_iterator_close(pfStack_1bb0);
    fdb_kvs_close(pfStack_1ba0);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void snapshot_with_uncomitted_data_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db0, *db1, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_seqnum_t seqnum;
    fdb_status s; (void)s;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    srand(1234);
    config = fdb_get_default_config();
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0*1024*1024;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test9", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db0, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db1, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db2, "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert docs in all KV stores
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db1, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    // try to open snapshot before commit
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_commit(db_file, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    seqnum = info.last_seqnum;

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    // now insert docs into default and db2 only, without commit
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // open snapshot on db1
    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // latest (comitted) seqnum
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on db2
    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db2, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on default KVS
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db0, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    memleak_end();

    TEST_RESULT("snapshot with uncomitted data in other KVS test");
}